

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.cc
# Opt level: O0

char * google::protobuf::io::anon_unknown_0::DoubleToBuffer(double value,char *buffer)

{
  Nonnull<char_*> pcVar1;
  char *pcVar2;
  uint uVar3;
  LogMessage *pLVar4;
  double dVar5;
  LogMessage local_c8;
  Voidify local_b5;
  int local_b4;
  FormatSpecTemplate<(absl::lts_20250127::FormatConversionCharSet)655355,_(absl::lts_20250127::FormatConversionCharSet)654848>
  local_b0;
  double local_a0;
  double parsed_value;
  byte local_81;
  LogMessage local_80;
  Voidify local_6d;
  int local_6c;
  FormatSpecTemplate<(absl::lts_20250127::FormatConversionCharSet)655355,_(absl::lts_20250127::FormatConversionCharSet)654848>
  local_68;
  int local_54;
  undefined1 local_50 [4];
  int snprintf_result;
  FormatSpecTemplate<> local_40;
  FormatSpecTemplate<> local_30;
  Nonnull<char_*> local_20;
  char *buffer_local;
  double value_local;
  
  local_20 = buffer;
  buffer_local = (char *)value;
  dVar5 = std::numeric_limits<double>::infinity();
  pcVar2 = buffer_local;
  pcVar1 = local_20;
  if ((value != dVar5) || (NAN(value) || NAN(dVar5))) {
    dVar5 = std::numeric_limits<double>::infinity();
    pcVar1 = local_20;
    if (((double)pcVar2 != -dVar5) || (NAN((double)pcVar2) || NAN(-dVar5))) {
      uVar3 = std::isnan((double)buffer_local);
      pcVar1 = local_20;
      if ((uVar3 & 1) == 0) {
        absl::lts_20250127::str_format_internal::
        FormatSpecTemplate<(absl::lts_20250127::FormatConversionCharSet)655355,_(absl::lts_20250127::FormatConversionCharSet)654848>
        ::FormatSpecTemplate(&local_68,"%.*g");
        local_6c = 0xf;
        local_54 = absl::lts_20250127::SNPrintF<int,_double>
                             (pcVar1,0x20,&local_68,&local_6c,(double *)&buffer_local);
        local_81 = 0;
        if (local_54 < 1 || 0x1f < local_54) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_80,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/strtod.cc"
                     ,0xe2,"snprintf_result > 0 && snprintf_result < kDoubleToBufferSize");
          local_81 = 1;
          pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_80);
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_6d,pLVar4);
        }
        if ((local_81 & 1) != 0) {
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_80);
        }
        local_a0 = NoLocaleStrtod(local_20,(char **)0x0);
        pcVar1 = local_20;
        if ((local_a0 != (double)buffer_local) || (NAN(local_a0) || NAN((double)buffer_local))) {
          absl::lts_20250127::str_format_internal::
          FormatSpecTemplate<(absl::lts_20250127::FormatConversionCharSet)655355,_(absl::lts_20250127::FormatConversionCharSet)654848>
          ::FormatSpecTemplate(&local_b0,"%.*g");
          local_b4 = 0x11;
          local_54 = absl::lts_20250127::SNPrintF<int,_double>
                               (pcVar1,0x20,&local_b0,&local_b4,(double *)&buffer_local);
          if (local_54 < 1 || 0x1f < local_54) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_c8,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/strtod.cc"
                       ,0xf0,"snprintf_result > 0 && snprintf_result < kDoubleToBufferSize");
            pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_c8);
            absl::lts_20250127::log_internal::Voidify::operator&&(&local_b5,pLVar4);
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_c8);
          }
        }
        DelocalizeRadix(local_20);
        value_local = (double)local_20;
      }
      else {
        absl::lts_20250127::str_format_internal::FormatSpecTemplate<>::FormatSpecTemplate
                  ((FormatSpecTemplate<> *)local_50,"nan");
        absl::lts_20250127::SNPrintF<>(pcVar1,0x20,(FormatSpec<> *)local_50);
        value_local = (double)local_20;
      }
    }
    else {
      absl::lts_20250127::str_format_internal::FormatSpecTemplate<>::FormatSpecTemplate
                (&local_40,"-inf");
      absl::lts_20250127::SNPrintF<>(pcVar1,0x20,&local_40);
      value_local = (double)local_20;
    }
  }
  else {
    absl::lts_20250127::str_format_internal::FormatSpecTemplate<>::FormatSpecTemplate
              (&local_30,"inf");
    absl::lts_20250127::SNPrintF<>(pcVar1,0x20,&local_30);
    value_local = (double)local_20;
  }
  return (char *)value_local;
}

Assistant:

char *DoubleToBuffer(double value, char *buffer) {
  // DBL_DIG is 15 for IEEE-754 doubles, which are used on almost all
  // platforms these days.  Just in case some system exists where DBL_DIG
  // is significantly larger -- and risks overflowing our buffer -- we have
  // this assert.
  static_assert(DBL_DIG < 20, "DBL_DIG_is_too_big");

  if (value == std::numeric_limits<double>::infinity()) {
    absl::SNPrintF(buffer, kDoubleToBufferSize, "inf");
    return buffer;
  } else if (value == -std::numeric_limits<double>::infinity()) {
    absl::SNPrintF(buffer, kDoubleToBufferSize, "-inf");
    return buffer;
  } else if (std::isnan(value)) {
    absl::SNPrintF(buffer, kDoubleToBufferSize, "nan");
    return buffer;
  }

  int snprintf_result =
      absl::SNPrintF(buffer, kDoubleToBufferSize, "%.*g", DBL_DIG, value);

  // The snprintf should never overflow because the buffer is significantly
  // larger than the precision we asked for.
  ABSL_DCHECK(snprintf_result > 0 && snprintf_result < kDoubleToBufferSize);

  // We need to make parsed_value volatile in order to force the compiler to
  // write it out to the stack.  Otherwise, it may keep the value in a
  // register, and if it does that, it may keep it as a long double instead
  // of a double.  This long double may have extra bits that make it compare
  // unequal to "value" even though it would be exactly equal if it were
  // truncated to a double.
  volatile double parsed_value = NoLocaleStrtod(buffer, nullptr);
  if (parsed_value != value) {
    snprintf_result =
        absl::SNPrintF(buffer, kDoubleToBufferSize, "%.*g", DBL_DIG + 2, value);

    // Should never overflow; see above.
    ABSL_DCHECK(snprintf_result > 0 && snprintf_result < kDoubleToBufferSize);
  }

  DelocalizeRadix(buffer);
  return buffer;
}